

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# necro.c
# Opt level: O2

void make_urn(CHAR_DATA *ch,OBJ_DATA *corpse)

{
  byte *pbVar1;
  char *pcVar2;
  char buf [4608];
  
  act("When this morbid sculpting is complete, $n is holding a solid receptacle.",ch,(void *)0x0,
      (void *)0x0,0);
  act("You craft a morbid urn from the coagulated blood of $p!",ch,corpse,(void *)0x0,3);
  if (corpse->item_type == 0x18) {
    if (corpse->owner != (char *)0x0) {
      free_pstring(corpse->description);
      snprintf(buf,0x1200,"The defiled corpse of %s is here, its heart missing.",corpse->owner);
      pcVar2 = palloc_string(buf);
      corpse->description = pcVar2;
      pbVar1 = (byte *)((long)corpse->wear_flags + 3);
      *pbVar1 = *pbVar1 | 8;
    }
  }
  else if (corpse->item_type == 0x17) {
    extract_obj(corpse);
    return;
  }
  return;
}

Assistant:

void make_urn(CHAR_DATA *ch, OBJ_DATA *corpse)
{
	char buf[MSL];

	act("When this morbid sculpting is complete, $n is holding a solid receptacle.", ch, 0, 0, TO_ROOM);
	act("You craft a morbid urn from the coagulated blood of $p!", ch, corpse, 0, TO_CHAR);

	if (corpse->item_type == ITEM_CORPSE_NPC)
	{
		extract_obj(corpse);
	}
	else if (corpse->item_type == ITEM_CORPSE_PC && corpse->owner)
	{
		free_pstring(corpse->description);
		
		std::snprintf(buf, static_cast<size_t>(MSL), "The defiled corpse of %s is here, its heart missing.", corpse->owner);
		corpse->description = palloc_string(buf);
		SET_BIT(corpse->wear_flags, CORPSE_NO_ANIMATE);
	}
}